

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

WhereTerm * whereNthSubterm(WhereTerm *pTerm,int N)

{
  WhereTerm *pWVar1;
  
  if (pTerm->eOperator != 0x400) {
    pWVar1 = (WhereTerm *)0x0;
    if (N == 0) {
      pWVar1 = pTerm;
    }
    return pWVar1;
  }
  if (N < (((pTerm->u).pOrInfo)->wc).nTerm) {
    return (((pTerm->u).pOrInfo)->wc).a + N;
  }
  return (WhereTerm *)0x0;
}

Assistant:

static WhereTerm *whereNthSubterm(WhereTerm *pTerm, int N){
  if( pTerm->eOperator!=WO_AND ){
    return N==0 ? pTerm : 0;
  }
  if( N<pTerm->u.pAndInfo->wc.nTerm ){
    return &pTerm->u.pAndInfo->wc.a[N];
  }
  return 0;
}